

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O2

uint32_t zmq::detail::read_u32_network_order(uchar *buf)

{
  uint uVar1;
  
  uVar1 = *(uint *)buf;
  return uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
}

Assistant:

inline uint32_t read_u32_network_order(const unsigned char *buf)
{
    if (is_little_endian()) {
        return (static_cast<uint32_t>(buf[0]) << 24)
               + (static_cast<uint32_t>(buf[1]) << 16)
               + (static_cast<uint32_t>(buf[2]) << 8)
               + static_cast<uint32_t>(buf[3]);
    } else {
        uint32_t value;
        std::memcpy(&value, buf, sizeof(value));
        return value;
    }
}